

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int *piVar1;
  double dVar2;
  double dVar3;
  pointer ppVar4;
  pointer ppVar5;
  pointer pdVar6;
  pointer piVar7;
  ulong uVar8;
  double *pdVar9;
  long lVar10;
  pointer ppVar11;
  ulong __n;
  bool bVar12;
  initializer_list<int> __l;
  initializer_list<double> __l_00;
  initializer_list<std::pair<int,_double>_> __l_01;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> expectedZip;
  vector<double,_std::allocator<double>_> test2;
  vector<int,_std::allocator<int>_> test1;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> outputZip;
  allocator_type local_91;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_48;
  undefined8 local_30;
  undefined4 local_28;
  undefined8 local_20;
  
  local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x300000001;
  local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3200000022;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l,(allocator_type *)&local_78);
  local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
  local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x4000000000000000;
  local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x4008000000000000;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_48;
  std::vector<double,_std::allocator<double>_>::vector(&local_78,__l_00,(allocator_type *)&local_90)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test zip...",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_48.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ff0000000000000;
  local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_48.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,3);
  local_30 = 0x4000000000000000;
  local_28 = 0x22;
  local_20 = 0x4008000000000000;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&local_48;
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            (&local_90,__l_01,&local_91);
  piVar7 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar6 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  __n = (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3;
  if (uVar8 <= __n) {
    __n = uVar8;
  }
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            (&local_48,__n,&local_91);
  if (local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar10 = 0;
    do {
      dVar2 = *(double *)((long)pdVar6 + lVar10 * 2);
      piVar1 = &(local_48.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first + lVar10;
      *piVar1 = *(int *)((long)piVar7 + lVar10);
      *(double *)(piVar1 + 2) = dVar2;
      lVar10 = lVar10 + 4;
    } while ((pointer)(piVar1 + 4) !=
             local_48.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if ((long)local_90.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_90.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)local_48.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_48.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    bVar12 = local_90.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start ==
             local_90.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (bVar12) {
LAB_0010244e:
      if (bVar12) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"passed!",7);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
        std::ostream::put('`');
        std::ostream::flush();
        if (local_48.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_90.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_90.
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        return 0;
      }
    }
    else if ((((local_90.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first ==
               (local_48.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first) &&
             ((local_90.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second ==
              (local_48.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second)) &&
            (!NAN((local_90.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second) &&
             !NAN((local_48.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second))) {
      pdVar9 = &local_48.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1].second;
      ppVar4 = local_90.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        ppVar11 = ppVar4 + 1;
        bVar12 = ppVar11 ==
                 local_90.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (bVar12) goto LAB_0010244e;
        if (ppVar11->first != ((pair<int,_double> *)(pdVar9 + -1))->first) break;
        ppVar5 = ppVar4 + 1;
        dVar2 = *pdVar9;
        dVar3 = *pdVar9;
        pdVar9 = pdVar9 + 2;
        if ((ppVar5->second != dVar3) || (ppVar4 = ppVar11, NAN(ppVar5->second) || NAN(dVar2)))
        break;
      }
    }
  }
  __assert_fail("expectedZip==outputZip",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/zip/main.cpp"
                ,0x18,"int main()");
}

Assistant:

int main(){

    
  
  vector<int> test1={1, 3, 34, 50};
  vector<double> test2={1.0, 2.0, 3.0};

  cout << "Test zip..." << endl;
  vector< pair<int,double> > expectedZip={
      make_pair(1,1.0),
      make_pair(3,2.0),
      make_pair(34, 3.0)      
  };
  auto outputZip = Functional::zip(test1, test2);  
  assert( expectedZip==outputZip);
  cout << "passed!" << endl;

  return 0;

}